

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O0

void __thiscall IGameController::OnReset(IGameController *this)

{
  int iVar1;
  CGameContext *pCVar2;
  IServer *pIVar3;
  IGameController *in_RDI;
  int i;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_c;
  
  for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
    pCVar2 = GameServer(in_RDI);
    if (pCVar2->m_apPlayers[local_c] != (CPlayer *)0x0) {
      pCVar2 = GameServer(in_RDI);
      pCVar2->m_apPlayers[local_c]->m_RespawnDisabled = false;
      GameServer(in_RDI);
      CPlayer::Respawn((CPlayer *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      pIVar3 = Server(in_RDI);
      in_stack_ffffffffffffffe0 = IServer::Tick(pIVar3);
      pIVar3 = Server(in_RDI);
      iVar1 = IServer::TickSpeed(pIVar3);
      in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe0 + iVar1 / 2;
      pCVar2 = GameServer(in_RDI);
      pCVar2->m_apPlayers[local_c]->m_RespawnTick = in_stack_ffffffffffffffe4;
      if (in_RDI->m_RoundCount == 0) {
        pCVar2 = GameServer(in_RDI);
        pCVar2->m_apPlayers[local_c]->m_Score = 0;
        pIVar3 = Server(in_RDI);
        iVar1 = IServer::Tick(pIVar3);
        pCVar2 = GameServer(in_RDI);
        pCVar2->m_apPlayers[local_c]->m_ScoreStartTick = iVar1;
      }
      pCVar2 = GameServer(in_RDI);
      pCVar2->m_apPlayers[local_c]->m_IsReadyToPlay = true;
    }
  }
  return;
}

Assistant:

void IGameController::OnReset()
{
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(GameServer()->m_apPlayers[i])
		{
			GameServer()->m_apPlayers[i]->m_RespawnDisabled = false;
			GameServer()->m_apPlayers[i]->Respawn();
			GameServer()->m_apPlayers[i]->m_RespawnTick = Server()->Tick()+Server()->TickSpeed()/2;
			if(m_RoundCount == 0)
			{
				GameServer()->m_apPlayers[i]->m_Score = 0;
				GameServer()->m_apPlayers[i]->m_ScoreStartTick = Server()->Tick();
			}
			GameServer()->m_apPlayers[i]->m_IsReadyToPlay = true;
		}
	}
}